

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v11::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  uint uVar1;
  uint uVar2;
  bigit bVar3;
  bigit bVar4;
  bigit bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  
  uVar1 = lhs1->exp_;
  iVar9 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + uVar1;
  uVar11 = lhs2->exp_;
  iVar12 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + uVar11;
  if (iVar12 < iVar9) {
    iVar12 = iVar9;
  }
  uVar2 = rhs->exp_;
  uVar10 = (ulong)uVar2;
  iVar9 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_ + uVar2;
  if (iVar12 + 1 < iVar9) {
    iVar6 = -1;
  }
  else if (iVar9 < iVar12) {
    iVar6 = 1;
  }
  else {
    if ((int)uVar1 < (int)uVar11) {
      uVar11 = uVar1;
    }
    if ((int)uVar2 <= (int)uVar11) {
      uVar11 = uVar2;
    }
    uVar8 = 0;
    while (iVar12 = (int)uVar10, (int)uVar11 < iVar9) {
      iVar12 = iVar9 + -1;
      bVar3 = bigint::get_bigit(lhs1,iVar12);
      bVar4 = bigint::get_bigit(lhs2,iVar12);
      bVar5 = bigint::get_bigit(rhs,iVar12);
      uVar7 = (bVar5 | uVar8) - ((ulong)bVar4 + (ulong)bVar3);
      if ((bVar5 | uVar8) < (ulong)bVar4 + (ulong)bVar3) {
        iVar12 = 1;
        break;
      }
      if (1 < uVar7) {
        iVar12 = -1;
        uVar8 = uVar7;
        break;
      }
      uVar8 = uVar7 << 0x20;
      iVar9 = iVar12;
    }
    iVar6 = -(uint)(uVar8 != 0);
    if ((int)uVar11 < iVar9) {
      iVar6 = iVar12;
    }
  }
  return iVar6;
}

Assistant:

FMT_CONSTEXPR auto num_bigits() const -> int {
    return static_cast<int>(bigits_.size()) + exp_;
  }